

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O2

CachedResourceView * __thiscall
Diligent::ShaderResourceCacheGL::GetConstImage(ShaderResourceCacheGL *this,Uint32 CacheOffset)

{
  ulong uVar1;
  char (*in_R8) [18];
  Uint32 CacheOffset_local;
  string msg;
  
  uVar1 = (ulong)this->m_ImagesOffset;
  if ((uint)((this->m_SSBOsOffset - uVar1) / 0x18) <= CacheOffset) {
    CacheOffset_local = CacheOffset;
    FormatString<char[21],unsigned_int,char[18]>
              (&msg,(Diligent *)"Image buffer index (",(char (*) [21])&CacheOffset_local,
               (uint *)") is out of range",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetConstImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0x134);
    std::__cxx11::string::~string((string *)&msg);
    uVar1 = (ulong)this->m_ImagesOffset;
    CacheOffset = CacheOffset_local;
  }
  return (CachedResourceView *)
         ((this->m_pResourceData)._M_t.
          super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          ._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
         (ulong)CacheOffset * 0x18 + uVar1);
}

Assistant:

const CachedResourceView& GetConstImage(Uint32 CacheOffset) const
    {
        VERIFY(CacheOffset < GetImageCount(), "Image buffer index (", CacheOffset, ") is out of range");
        return reinterpret_cast<CachedResourceView*>(m_pResourceData.get() + m_ImagesOffset)[CacheOffset];
    }